

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O2

bool __thiscall WorldShuffler::is_region_avoidable(WorldShuffler *this,WorldRegion *region)

{
  bool bVar1;
  WorldNode *start_node;
  WorldNode *end_node;
  WorldSolver solver;
  _Vector_base<Item_*,_std::allocator<Item_*>_> _Stack_168;
  WorldSolver local_150;
  
  WorldSolver::WorldSolver(&local_150,this->_world);
  WorldSolver::forbid_taking_items_from_nodes(&local_150,&region->_nodes);
  start_node = RandomizerWorld::spawn_node(this->_world);
  end_node = RandomizerWorld::end_node(this->_world);
  World::starting_inventory
            ((vector<Item_*,_std::allocator<Item_*>_> *)&_Stack_168,&this->_world->super_World);
  bVar1 = WorldSolver::try_to_solve
                    (&local_150,start_node,end_node,
                     (vector<Item_*,_std::allocator<Item_*>_> *)&_Stack_168);
  std::_Vector_base<Item_*,_std::allocator<Item_*>_>::~_Vector_base(&_Stack_168);
  WorldSolver::~WorldSolver(&local_150);
  return bVar1;
}

Assistant:

bool WorldShuffler::is_region_avoidable(WorldRegion* region) const
{
    WorldSolver solver(_world);
    solver.forbid_taking_items_from_nodes(region->nodes());
    return solver.try_to_solve(_world.spawn_node(), _world.end_node(), _world.starting_inventory());
}